

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cMultiBindTests.cpp
# Opt level: O0

IterateResult __thiscall
gl4cts::MultiBind::FunctionalBindTexturesTest::iterate(FunctionalBindTexturesTest *this)

{
  pointer *ppuVar1;
  GLuint GVar2;
  glBindTexturesFunc p_Var3;
  Context *pCVar4;
  GLint GVar5;
  undefined4 uVar6;
  GLboolean GVar7;
  int iVar8;
  GLenum GVar9;
  GLenum pname;
  RenderContext *pRVar10;
  undefined4 extraout_var;
  reference pvVar11;
  reference pvVar12;
  TestContext *pTVar13;
  TestLog *this_00;
  MessageBuilder *pMVar14;
  TestError *this_01;
  Enum<int,_2UL> EVar15;
  GLuint local_28c;
  GLint i_8;
  Enum<int,_2UL> local_278;
  GetNameFunc local_268;
  int local_260;
  Enum<int,_2UL> local_258;
  int local_244;
  MessageBuilder local_240;
  GLenum local_c0;
  GLuint local_bc;
  GLenum generated_error;
  GLint i_7;
  GLint i_6;
  GLint i_5;
  GLint i_4;
  GLint half_index;
  GLint i_3;
  GLint i_2;
  GLint i_1;
  GLenum target;
  size_t i;
  undefined1 local_80 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> t_texture_ids;
  vector<unsigned_int,_std::allocator<unsigned_int>_> texture_ids;
  vector<gl4cts::MultiBind::Texture,_std::allocator<gl4cts::MultiBind::Texture>_> texture;
  Buffer buffer;
  GLint max_textures;
  GLuint invalid_id;
  Functions *gl;
  FunctionalBindTexturesTest *this_local;
  Functions *gl_00;
  
  pRVar10 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar8 = (*pRVar10->_vptr_RenderContext[3])();
  gl_00 = (Functions *)CONCAT44(extraout_var,iVar8);
  buffer._20_4_ = 1;
  buffer.m_target = 0;
  (*gl_00->getIntegerv)(0x8b4d,(GLint *)&buffer.m_target);
  GVar9 = (*gl_00->getError)();
  glu::checkError(GVar9,"GetIntegerv",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cMultiBindTests.cpp"
                  ,0xab7);
  MultiBind::Buffer::Buffer
            ((Buffer *)
             &texture.
              super__Vector_base<gl4cts::MultiBind::Texture,_std::allocator<gl4cts::MultiBind::Texture>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  ppuVar1 = &texture_ids.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  std::vector<gl4cts::MultiBind::Texture,_std::allocator<gl4cts::MultiBind::Texture>_>::vector
            ((vector<gl4cts::MultiBind::Texture,_std::allocator<gl4cts::MultiBind::Texture>_> *)
             ppuVar1);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             &t_texture_ids.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_80);
  std::vector<gl4cts::MultiBind::Texture,_std::allocator<gl4cts::MultiBind::Texture>_>::resize
            ((vector<gl4cts::MultiBind::Texture,_std::allocator<gl4cts::MultiBind::Texture>_> *)
             ppuVar1,(long)(int)buffer.m_target);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             &t_texture_ids.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,(long)(int)buffer.m_target);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_80,
             (long)(int)buffer.m_target);
  MultiBind::Buffer::InitData
            ((Buffer *)
             &texture.
              super__Vector_base<gl4cts::MultiBind::Texture,_std::allocator<gl4cts::MultiBind::Texture>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,(this->super_TestCase).m_context,
             0x8c2a,0x88ea,0x10,(GLvoid *)0x0);
  for (_i_1 = 0; _i_1 < 0xb; _i_1 = _i_1 + 1) {
    i_2 = *(GLint *)(s_texture_infos + _i_1 * 0x10);
    if (i_2 == 0x8c2a) {
      pvVar11 = std::vector<gl4cts::MultiBind::Texture,_std::allocator<gl4cts::MultiBind::Texture>_>
                ::operator[]((vector<gl4cts::MultiBind::Texture,_std::allocator<gl4cts::MultiBind::Texture>_>
                              *)&texture_ids.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage,_i_1);
      MultiBind::Texture::InitBuffer
                (pvVar11,(this->super_TestCase).m_context,0x8058,
                 (GLuint)texture.
                         super__Vector_base<gl4cts::MultiBind::Texture,_std::allocator<gl4cts::MultiBind::Texture>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
    }
    else {
      pvVar11 = std::vector<gl4cts::MultiBind::Texture,_std::allocator<gl4cts::MultiBind::Texture>_>
                ::operator[]((vector<gl4cts::MultiBind::Texture,_std::allocator<gl4cts::MultiBind::Texture>_>
                              *)&texture_ids.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage,_i_1);
      MultiBind::Texture::InitStorage
                (pvVar11,(this->super_TestCase).m_context,i_2,1,0x8058,6,6,6,false);
    }
    MultiBind::Texture::Bind(gl_00,0,i_2);
  }
  for (i_3 = 0xb; i_3 < (int)buffer.m_target; i_3 = i_3 + 1) {
    pvVar11 = std::vector<gl4cts::MultiBind::Texture,_std::allocator<gl4cts::MultiBind::Texture>_>::
              operator[]((vector<gl4cts::MultiBind::Texture,_std::allocator<gl4cts::MultiBind::Texture>_>
                          *)&texture_ids.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_end_of_storage,(long)i_3);
    MultiBind::Texture::InitStorage
              (pvVar11,(this->super_TestCase).m_context,0xde1,1,0x8058,6,6,6,false);
  }
  MultiBind::Texture::Bind(gl_00,0,0xde1);
  for (half_index = 0; GVar9 = buffer.m_target, half_index < (int)buffer.m_target;
      half_index = half_index + 1) {
    pvVar11 = std::vector<gl4cts::MultiBind::Texture,_std::allocator<gl4cts::MultiBind::Texture>_>::
              operator[]((vector<gl4cts::MultiBind::Texture,_std::allocator<gl4cts::MultiBind::Texture>_>
                          *)&texture_ids.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_end_of_storage,(long)half_index);
    GVar2 = pvVar11->m_id;
    pvVar12 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                         &t_texture_ids.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage,(long)half_index);
    *pvVar12 = GVar2;
  }
  p_Var3 = gl_00->bindTextures;
  pvVar12 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                       &t_texture_ids.
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage,0);
  (*p_Var3)(0,GVar9,pvVar12);
  GVar9 = (*gl_00->getError)();
  glu::checkError(GVar9,"BindTextures",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cMultiBindTests.cpp"
                  ,0xaeb);
  for (i_4 = 0; i_4 < (int)buffer.m_target; i_4 = i_4 + 1) {
    pCVar4 = (this->super_TestCase).m_context;
    GVar9 = getBinding(i_4);
    GVar5 = i_4;
    pvVar12 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                         &t_texture_ids.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage,(long)i_4);
    checkTextureBinding(pCVar4,GVar9,GVar5,*pvVar12);
  }
  i_5 = (int)buffer.m_target / 2;
  for (i_6 = 0; GVar5 = i_5, i_6 < (int)buffer.m_target; i_6 = i_6 + 1) {
    pvVar12 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_80,(long)i_6);
    *pvVar12 = 0;
  }
  p_Var3 = gl_00->bindTextures;
  pvVar12 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_80,0);
  (*p_Var3)(0,GVar5,pvVar12);
  GVar9 = (*gl_00->getError)();
  glu::checkError(GVar9,"BindTextures",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cMultiBindTests.cpp"
                  ,0xb00);
  for (i_7 = 0; i_7 < i_5; i_7 = i_7 + 1) {
    pCVar4 = (this->super_TestCase).m_context;
    GVar9 = getBinding(i_7);
    checkTextureBinding(pCVar4,GVar9,i_7,0);
  }
  for (generated_error = i_5; (int)generated_error < (int)buffer.m_target;
      generated_error = generated_error + 1) {
    pCVar4 = (this->super_TestCase).m_context;
    pname = getBinding(generated_error);
    GVar9 = generated_error;
    pvVar12 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                         &t_texture_ids.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage,(long)(int)generated_error);
    checkTextureBinding(pCVar4,pname,GVar9,*pvVar12);
  }
  (*gl_00->bindTextures)(i_5,buffer.m_target - i_5,(GLuint *)0x0);
  GVar9 = (*gl_00->getError)();
  glu::checkError(GVar9,"BindTextures",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cMultiBindTests.cpp"
                  ,0xb13);
  for (local_bc = 0; (int)local_bc < (int)buffer.m_target; local_bc = local_bc + 1) {
    pCVar4 = (this->super_TestCase).m_context;
    GVar9 = getBinding(local_bc);
    checkTextureBinding(pCVar4,GVar9,local_bc,0);
  }
  while (GVar7 = (*gl_00->isTexture)(buffer._20_4_), uVar6 = buffer._20_4_, GVar7 == '\x01') {
    buffer._20_4_ = buffer._20_4_ + 1;
  }
  ppuVar1 = &t_texture_ids.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  pvVar12 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)ppuVar1,0);
  GVar9 = buffer.m_target;
  *pvVar12 = uVar6;
  p_Var3 = gl_00->bindTextures;
  pvVar12 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)ppuVar1,0);
  (*p_Var3)(0,GVar9,pvVar12);
  local_c0 = (*gl_00->getError)();
  if (local_c0 == 0x502) {
    pCVar4 = (this->super_TestCase).m_context;
    GVar9 = getBinding(0);
    checkTextureBinding(pCVar4,GVar9,0,0);
    for (local_28c = 1; (int)local_28c < (int)buffer.m_target; local_28c = local_28c + 1) {
      pCVar4 = (this->super_TestCase).m_context;
      GVar9 = getBinding(local_28c);
      pvVar12 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                          ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                           &t_texture_ids.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage,(long)(int)local_28c);
      checkTextureBinding(pCVar4,GVar9,local_28c,*pvVar12);
    }
    (*gl_00->bindTextures)(0,buffer.m_target,(GLuint *)0x0);
    GVar9 = (*gl_00->getError)();
    glu::checkError(GVar9,"BindTextures",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cMultiBindTests.cpp"
                    ,0xb3b);
    pTVar13 = deqp::Context::getTestContext((this->super_TestCase).m_context);
    tcu::TestContext::setTestResult(pTVar13,QP_TEST_RESULT_PASS,"Pass");
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_80);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
               &t_texture_ids.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage);
    std::vector<gl4cts::MultiBind::Texture,_std::allocator<gl4cts::MultiBind::Texture>_>::~vector
              ((vector<gl4cts::MultiBind::Texture,_std::allocator<gl4cts::MultiBind::Texture>_> *)
               &texture_ids.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    MultiBind::Buffer::~Buffer
              ((Buffer *)
               &texture.
                super__Vector_base<gl4cts::MultiBind::Texture,_std::allocator<gl4cts::MultiBind::Texture>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    return STOP;
  }
  pTVar13 = deqp::Context::getTestContext((this->super_TestCase).m_context);
  this_00 = tcu::TestContext::getLog(pTVar13);
  tcu::TestLog::operator<<(&local_240,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar14 = tcu::MessageBuilder::operator<<(&local_240,(char (*) [7])0x2a28b75);
  pMVar14 = tcu::MessageBuilder::operator<<
                      (pMVar14,(char (*) [128])
                               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cMultiBindTests.cpp"
                      );
  pMVar14 = tcu::MessageBuilder::operator<<(pMVar14,(char (*) [9])", line: ");
  local_244 = 0xb31;
  pMVar14 = tcu::MessageBuilder::operator<<(pMVar14,&local_244);
  pMVar14 = tcu::MessageBuilder::operator<<(pMVar14,(char (*) [20])". Got wrong error: ");
  EVar15 = glu::getErrorStr(local_c0);
  local_268 = EVar15.m_getName;
  local_260 = EVar15.m_value;
  local_258.m_getName = local_268;
  local_258.m_value = local_260;
  pMVar14 = tcu::MessageBuilder::operator<<(pMVar14,&local_258);
  pMVar14 = tcu::MessageBuilder::operator<<(pMVar14,(char (*) [13])0x2a14159);
  EVar15 = glu::getErrorStr(0x502);
  local_278.m_getName = EVar15.m_getName;
  local_278.m_value = EVar15.m_value;
  pMVar14 = tcu::MessageBuilder::operator<<(pMVar14,&local_278);
  pMVar14 = tcu::MessageBuilder::operator<<(pMVar14,(char (*) [12])", message: ");
  pMVar14 = tcu::MessageBuilder::operator<<
                      (pMVar14,(char (*) [37])"BindTextures with invalid texture id");
  tcu::MessageBuilder::operator<<(pMVar14,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_240);
  this_01 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_01,"Invalid error generated",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cMultiBindTests.cpp"
             ,0xb31);
  __cxa_throw(this_01,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
}

Assistant:

tcu::TestNode::IterateResult FunctionalBindTexturesTest::iterate()
{
	static const GLuint depth  = 6;
	static const GLuint height = 6;
	static const GLuint width  = 6;

	const Functions& gl = m_context.getRenderContext().getFunctions();

#if DEBUG_ENBALE_MESSAGE_CALLBACK
	gl.debugMessageCallback(debug_proc, &m_context);
	GLU_EXPECT_NO_ERROR(gl.getError(), "DebugMessageCallback");
#endif /* DEBUG_ENBALE_MESSAGE_CALLBACK */

	GLuint invalid_id   = 1; /* Start with 1, as 0 is not valid name */
	GLint  max_textures = 0;

	/* Get max */
	gl.getIntegerv(GL_MAX_COMBINED_TEXTURE_IMAGE_UNITS, &max_textures);
	GLU_EXPECT_NO_ERROR(gl.getError(), "GetIntegerv");

	/* Storage */
	Buffer				 buffer;
	std::vector<Texture> texture;
	std::vector<GLuint>  texture_ids;
	std::vector<GLuint>  t_texture_ids;

	texture.resize(max_textures);
	texture_ids.resize(max_textures);
	t_texture_ids.resize(max_textures);

	/* Prepare buffer */
	buffer.InitData(m_context, GL_TEXTURE_BUFFER, GL_DYNAMIC_COPY, 16 /* size */, 0 /* data */);

	/* Prepare textures */
	for (size_t i = 0; i < s_n_texture_tragets; ++i)
	{
		const GLenum target = s_texture_infos[i].m_target;

		if (GL_TEXTURE_BUFFER != target)
		{
			texture[i].InitStorage(m_context, target, 1, GL_RGBA8, width, height, depth);
		}
		else
		{
			texture[i].InitBuffer(m_context, GL_RGBA8, buffer.m_id);
		}

		/* Unbind */
		Texture::Bind(gl, 0, target);
	}

	for (GLint i = s_n_texture_tragets; i < max_textures; ++i)
	{
		texture[i].InitStorage(m_context, GL_TEXTURE_2D, 1, GL_RGBA8, width, height, depth);
	}

	/* Unbind */
	Texture::Bind(gl, 0, GL_TEXTURE_2D);

	for (GLint i = 0; i < max_textures; ++i)
	{
		texture_ids[i] = texture[i].m_id;
	}

	/*
	 * - execute BindTextures to bind all textures;
	 * - inspect bindings of all texture units to verify that proper bindings were
	 * set;
	 */
	gl.bindTextures(0, max_textures, &texture_ids[0]);
	GLU_EXPECT_NO_ERROR(gl.getError(), "BindTextures");

	for (GLint i = 0; i < max_textures; ++i)
	{
		checkTextureBinding(m_context, getBinding(i), i, texture_ids[i]);
	}

	/*
	 * - execute BindTextures for the first half of units with <textures> filled
	 * with zeros, to unbind those units;
	 * - inspect bindings of all texture units to verify that proper bindings were
	 * unbound;
	 */
	GLint half_index = max_textures / 2;

	for (GLint i = 0; i < max_textures; ++i)
	{
		t_texture_ids[i] = 0;
	}

	gl.bindTextures(0, half_index, &t_texture_ids[0]);
	GLU_EXPECT_NO_ERROR(gl.getError(), "BindTextures");

	for (GLint i = 0; i < half_index; ++i)
	{
		checkTextureBinding(m_context, getBinding(i), i, 0);
	}

	for (GLint i = half_index; i < max_textures; ++i)
	{
		checkTextureBinding(m_context, getBinding(i), i, texture_ids[i]);
	}

	/*
	 * - execute BindTextures for the second half of units with NULL as<textures>,
	 * to unbind those units;
	 * - inspect bindings of all texture units to verify that proper bindings were
	 * unbound;
	 */
	gl.bindTextures(half_index, max_textures - half_index, 0);
	GLU_EXPECT_NO_ERROR(gl.getError(), "BindTextures");

	for (GLint i = 0; i < max_textures; ++i)
	{
		checkTextureBinding(m_context, getBinding(i), i, 0);
	}

	/*
	 * - modify <textures> so first entry is invalid;
	 * - execute BindTextures to bind all textures; It is expected that
	 * INVALID_OPERATION will be generated;
	 * - inspect bindings of all texture units to verify that proper bindings were
	 * set;
	 */

	/* Find invalid id */
	while (1)
	{
		if (GL_TRUE != gl.isTexture(invalid_id))
		{
			break;
		}

		invalid_id += 1;
	}

	/* Set invalid id */
	texture_ids[0] = invalid_id;

	gl.bindTextures(0, max_textures, &texture_ids[0]);
	CHECK_ERROR(GL_INVALID_OPERATION, "BindTextures with invalid texture id");

	checkTextureBinding(m_context, getBinding(0), 0, 0);
	for (GLint i = 1; i < max_textures; ++i)
	{
		checkTextureBinding(m_context, getBinding(i), i, texture_ids[i]);
	}

	/* - unbind all textures. */
	gl.bindTextures(0, max_textures, 0);
	GLU_EXPECT_NO_ERROR(gl.getError(), "BindTextures");

	/* Set result */
	m_context.getTestContext().setTestResult(QP_TEST_RESULT_PASS, "Pass");

	/* Done */
	return tcu::TestNode::STOP;
}